

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O0

void Extra_TruthStretch(uint *pOut,uint *pIn,int nVars,int nVarsAll,uint Phase)

{
  uint *puVar1;
  bool bVar2;
  int local_3c;
  int Counter;
  int Var;
  int k;
  int i;
  uint *pTemp;
  uint Phase_local;
  int nVarsAll_local;
  int nVars_local;
  uint *pIn_local;
  uint *pOut_local;
  
  local_3c = nVars + -1;
  bVar2 = false;
  _nVarsAll_local = pIn;
  pIn_local = pOut;
  for (Var = nVarsAll + -1; -1 < Var; Var = Var + -1) {
    if ((Phase & 1 << ((byte)Var & 0x1f)) != 0) {
      for (Counter = local_3c; Counter < Var; Counter = Counter + 1) {
        Extra_TruthSwapAdjacentVars(pIn_local,_nVarsAll_local,nVarsAll,Counter);
        puVar1 = pIn_local;
        pIn_local = _nVarsAll_local;
        bVar2 = (bool)(bVar2 ^ 1);
        _nVarsAll_local = puVar1;
      }
      local_3c = local_3c + -1;
    }
  }
  if (local_3c == -1) {
    if (!bVar2) {
      Extra_TruthCopy(pIn_local,_nVarsAll_local,nVarsAll);
    }
    return;
  }
  __assert_fail("Var == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilTruth.c"
                ,0xf9,
                "void Extra_TruthStretch(unsigned int *, unsigned int *, int, int, unsigned int)");
}

Assistant:

void Extra_TruthStretch( unsigned * pOut, unsigned * pIn, int nVars, int nVarsAll, unsigned Phase )
{
    unsigned * pTemp;
    int i, k, Var = nVars - 1, Counter = 0;
    for ( i = nVarsAll - 1; i >= 0; i-- )
        if ( Phase & (1 << i) )
        {
            for ( k = Var; k < i; k++ )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVarsAll, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                Counter++;
            }
            Var--;
        }
    assert( Var == -1 );
    // swap if it was moved an even number of times
    if ( !(Counter & 1) )
        Extra_TruthCopy( pOut, pIn, nVarsAll );
}